

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O0

void QGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  qreal *pqVar2;
  bool bVar3;
  int iVar4;
  GestureCancelPolicy GVar5;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QPointF QVar6;
  void *_v_1;
  void *_v;
  QGesture *_t;
  undefined4 in_stack_ffffffffffffff98;
  GestureCancelPolicy in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  qreal local_18;
  qreal local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 6) {
    if (in_EDX == 0) {
      iVar4 = qRegisterMetaType<Qt::GestureState>();
      *(int *)*in_RCX = iVar4;
    }
    else if (in_EDX == 1) {
      iVar4 = qRegisterMetaType<Qt::GestureType>();
      *(int *)*in_RCX = iVar4;
    }
    else if (in_EDX == 2) {
      iVar4 = qRegisterMetaType<QGesture::GestureCancelPolicy>();
      *(int *)*in_RCX = iVar4;
    }
    else {
      *(undefined4 *)*in_RCX = 0xffffffff;
    }
  }
  if (in_ESI == 1) {
    pqVar2 = (qreal *)*in_RCX;
    switch((QGesture *)(ulong)in_EDX) {
    case (QGesture *)0x0:
      GVar5 = state((QGesture *)0x2fd7e1);
      *(GestureCancelPolicy *)pqVar2 = GVar5;
      break;
    case (QGesture *)0x1:
      GVar5 = gestureType((QGesture *)0x2fd7f6);
      *(GestureCancelPolicy *)pqVar2 = GVar5;
      break;
    case (QGesture *)0x2:
      GVar5 = gestureCancelPolicy((QGesture *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      *(GestureCancelPolicy *)pqVar2 = GVar5;
      break;
    case (QGesture *)0x3:
      QVar6 = hotSpot((QGesture *)(ulong)in_EDX);
      local_18 = QVar6.xp;
      *pqVar2 = local_18;
      local_10 = QVar6.yp;
      pqVar2[1] = local_10;
      break;
    case (QGesture *)0x4:
      bVar3 = hasHotSpot((QGesture *)0x2fd84e);
      *(bool *)pqVar2 = bVar3;
    }
  }
  if (in_ESI == 2) {
    if (in_EDX == 2) {
      setGestureCancelPolicy
                ((QGesture *)CONCAT44(2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    }
    else if (in_EDX == 3) {
      setHotSpot((QGesture *)CONCAT44(3,in_stack_ffffffffffffffa0),
                 (QPointF *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
  }
  if ((in_ESI == 3) && (in_EDX == 3)) {
    unsetHotSpot((QGesture *)0x2fd8d2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGesture *>(_o);
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 2:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QGesture::GestureCancelPolicy >(); break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< Qt::GestureState >(); break;
        case 1:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< Qt::GestureType >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::GestureState*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast<Qt::GestureType*>(_v) = _t->gestureType(); break;
        case 2: *reinterpret_cast<QGesture::GestureCancelPolicy*>(_v) = _t->gestureCancelPolicy(); break;
        case 3: *reinterpret_cast<QPointF*>(_v) = _t->hotSpot(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->hasHotSpot(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 2: _t->setGestureCancelPolicy(*reinterpret_cast<QGesture::GestureCancelPolicy*>(_v)); break;
        case 3: _t->setHotSpot(*reinterpret_cast<QPointF*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 3: _t->unsetHotSpot(); break;
        default: break;
        }
    }
}